

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  ValueType extraout_RDX;
  ValueType extraout_RDX_00;
  ValueType type;
  undefined1 auVar7 [16];
  string local_c0;
  interp *local_a0;
  string local_98;
  string local_78;
  ValueType local_58;
  ValueType local_50;
  string local_48;
  string *local_28;
  string *out_msg_local;
  GlobalType *actual_local;
  GlobalType *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  if (actual->mut != expected->mut) {
    pcVar4 = GetName(actual->mut);
    pcVar5 = GetName(actual_local->mut);
    StringPrintf_abi_cxx11_
              (&local_48,"mutability mismatch in imported global, expected %s but got %s.",pcVar4,
               pcVar5);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result((Result *)((long)&expected_local + 4),Error);
    return (Result)expected_local._4_4_;
  }
  EVar2 = Type::operator_cast_to_Enum((Type *)&(actual->super_ExternType).field_0xc);
  EVar3 = Type::operator_cast_to_Enum((Type *)&(actual_local->super_ExternType).field_0xc);
  if (EVar2 == EVar3) {
LAB_00276e4f:
    Result::Result((Result *)((long)&expected_local + 4),Ok);
  }
  else {
    type = extraout_RDX;
    if (actual_local->mut != Var) {
      local_50 = *(ValueType *)&(actual_local->super_ExternType).field_0xc;
      local_58 = *(ValueType *)((long)&out_msg_local->_M_string_length + 4);
      bVar1 = TypesMatch(local_50,local_58);
      type = extraout_RDX_00;
      if (bVar1) goto LAB_00276e4f;
    }
    local_a0 = *(interp **)&(actual_local->super_ExternType).field_0xc;
    GetName_abi_cxx11_(&local_98,local_a0,type);
    auVar7 = std::__cxx11::string::c_str();
    GetName_abi_cxx11_(&local_c0,*(interp **)((long)&out_msg_local->_M_string_length + 4),
                       auVar7._8_8_);
    uVar6 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              (&local_78,"type mismatch in imported global, expected %s but got %s.",auVar7._0_8_,
               uVar6);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type).c_str(), GetName(actual.type).c_str());
    return Result::Error;
  }

  return Result::Ok;
}